

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::Array<capnp::compiler::NodeTranslator::BrandedDecl>::~Array
          (Array<capnp::compiler::NodeTranslator::BrandedDecl> *this)

{
  dispose(this);
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }